

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.h
# Opt level: O2

void __thiscall vpl::Scope::LoadVariableAddr(Scope *this,string *name)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  runtime_error *this_00;
  __normal_iterator<vpl::NameScope_*,_std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>_>
  __tmp;
  pointer pNVar4;
  pointer this_01;
  string local_1d0 [32];
  stringstream ss;
  ostream local_1a0 [376];
  
  poVar3 = std::operator<<(this->out_,'#');
  poVar3 = std::operator<<(poVar3,"void vpl::Scope::LoadVariableAddr(const std::string &)");
  std::operator<<(poVar3,'\n');
  this_01 = (this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    pNVar4 = this_01;
    if (pNVar4 == (this->scopes_).
                  super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>._M_impl.
                  super__Vector_impl_data._M_start) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar3 = std::operator<<(local_1a0,"Undefined variable `");
      poVar3 = std::operator<<(poVar3,(string *)name);
      std::operator<<(poVar3,'`');
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1d0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_01 = pNVar4 + -1;
    bVar1 = NameScope::Contains(this_01,name);
  } while (!bVar1);
  bVar1 = pNVar4[-1].is_global_;
  poVar3 = std::operator<<(this->out_,"    push ");
  if (bVar1 == false) {
    iVar2 = NameScope::GetOffset(this_01,name);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<(this->out_,"    push %");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,1);
    std::operator<<(poVar3,'\n');
    std::operator<<(this->out_,"    add\n");
  }
  else {
    poVar3 = std::operator<<(poVar3,(string *)name);
    std::operator<<(poVar3,'\n');
  }
  this->cur_stack_pos_ = this->cur_stack_pos_ + 1;
  return;
}

Assistant:

void LoadVariableAddr(const std::string& name) {
        LOG
        for (auto iter = scopes_.rbegin(); iter != scopes_.rend(); ++iter) {
            if (iter->Contains(name)) {
                if (!iter->IsGlobal()) {
                    out_ << "    push " << iter->GetOffset(name) << '\n';
                    out_ << "    push %" << StackPointerRegister() << '\n';
                    out_ << "    add\n";
                } else {
                    out_ << "    push " << name << '\n';
                }
                ++cur_stack_pos_;
                return;
            }
        }
        std::stringstream ss;
        ss << "Undefined variable `" << name << '`';
        throw std::runtime_error(ss.str());
    }